

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::
str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
          (String *__return_storage_ptr__,kj *this,char (*params) [71],String *params_1,
          char (*params_2) [9],StringPtr *params_3,char (*params_4) [2],StringPtr *params_5,
          char (*params_6) [32])

{
  char *pcVar1;
  kj *local_a0;
  size_t local_98;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_98 = strlen((char *)this);
  pcVar1 = *(char **)(*params + 8);
  local_40.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_40.ptr = *(char **)*params;
  }
  local_40.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_40.size_ = (size_t)(pcVar1 + -1);
  }
  local_a0 = this;
  local_50.size_ = strlen((char *)params_1);
  local_60.ptr = *(char **)*params_2;
  local_60.size_ = *(long *)(*params_2 + 8) - 1;
  local_50.ptr = (char *)params_1;
  local_70.size_ = strlen((char *)params_3);
  local_80.ptr = *(char **)params_4;
  local_80.size_ = *(long *)(params_4 + 4) - 1;
  local_70.ptr = (char *)params_3;
  local_90.size_ = strlen((char *)params_5);
  local_90.ptr = (char *)params_5;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_a0,&local_40,&local_50,&local_60,&local_70,&local_80
             ,&local_90,(ArrayPtr<const_char> *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}